

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O1

void polyscope::view::setNavigateStyle(NavigateStyle newStyle,bool animateFlight)

{
  int iVar1;
  bool bVar2;
  mat4x4 T;
  mat4 mStack_48;
  
  iVar1 = style;
  style = newStyle;
  if ((newStyle == Free) || ((newStyle == FirstPerson && (iVar1 == 0)))) {
    return;
  }
  if (animateFlight) {
    computeHomeView();
    nearClipRatio = 0x3f747ae147ae147b;
    farClipRatio = 0x4034000000000000;
    startFlightTo(&mStack_48,45.0,0.4);
    return;
  }
  bVar2 = viewIsValid();
  if (bVar2) {
    computeHomeView();
    viewMat = mStack_48.value[0].field_0;
    viewMat_4 = mStack_48.value[0].field_1;
    DAT_006006ac._0_4_ = mStack_48.value[0].field_2;
    DAT_006006ac._4_4_ = mStack_48.value[0].field_3;
    DAT_006006b4._0_4_ = mStack_48.value[1].field_0;
    DAT_006006b4._4_4_ = mStack_48.value[1].field_1;
    DAT_006006bc = mStack_48.value[1].field_2;
    _DAT_006006c0 = mStack_48.value[1].field_3;
    DAT_006006c4._0_4_ = mStack_48.value[2].field_0;
    DAT_006006c4._4_4_ = mStack_48.value[2].field_1;
    DAT_006006cc._0_4_ = mStack_48.value[2].field_2;
    DAT_006006cc._4_4_ = mStack_48.value[2].field_3;
    DAT_006006d4._0_4_ = mStack_48.value[3].field_0;
    DAT_006006d4._4_4_ = mStack_48.value[3].field_1;
    DAT_006006dc._0_4_ = mStack_48.value[3].field_2;
    DAT_006006dc._4_4_ = mStack_48.value[3].field_3;
    fov = 0x4046800000000000;
    nearClipRatio = 0x3f747ae147ae147b;
    farClipRatio = 0x4034000000000000;
    requestRedraw();
    return;
  }
  return;
}

Assistant:

void setNavigateStyle(NavigateStyle newStyle, bool animateFlight) {
  NavigateStyle oldStyle = style;
  style = newStyle;

  // for a few combinations of views, we can leave the camera where it is rather than resetting to the home view
  if (newStyle == NavigateStyle::Free ||
      (newStyle == NavigateStyle::FirstPerson && oldStyle == NavigateStyle::Turntable)) {
    return;
  }

  // reset to the home view
  if (animateFlight) {
    flyToHomeView();
  } else {
    resetCameraToHomeView();
  }
}